

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int vstateVPop(xmlValidCtxtPtr ctxt)

{
  xmlElementPtr pxVar1;
  xmlElementPtr elemDecl;
  xmlValidCtxtPtr ctxt_local;
  
  if (ctxt->vstateNr < 1) {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->vstateNr = ctxt->vstateNr + -1;
    pxVar1 = ctxt->vstateTab[ctxt->vstateNr].elemDecl;
    ctxt->vstateTab[ctxt->vstateNr].elemDecl = (xmlElementPtr)0x0;
    ctxt->vstateTab[ctxt->vstateNr].node = (xmlNodePtr)0x0;
    if ((pxVar1 != (xmlElementPtr)0x0) && (pxVar1->etype == XML_ELEMENT_TYPE_ELEMENT)) {
      xmlRegFreeExecCtxt(ctxt->vstateTab[ctxt->vstateNr].exec);
    }
    ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
    if (ctxt->vstateNr < 1) {
      ctxt->vstate = (xmlValidState *)0x0;
    }
    else {
      ctxt->vstate = ctxt->vstateTab + (ctxt->vstateNr + -1);
    }
    ctxt_local._4_4_ = ctxt->vstateNr;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
vstateVPop(xmlValidCtxtPtr ctxt) {
    xmlElementPtr elemDecl;

    if (ctxt->vstateNr < 1) return(-1);
    ctxt->vstateNr--;
    elemDecl = ctxt->vstateTab[ctxt->vstateNr].elemDecl;
    ctxt->vstateTab[ctxt->vstateNr].elemDecl = NULL;
    ctxt->vstateTab[ctxt->vstateNr].node = NULL;
    if ((elemDecl != NULL) && (elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT)) {
	xmlRegFreeExecCtxt(ctxt->vstateTab[ctxt->vstateNr].exec);
    }
    ctxt->vstateTab[ctxt->vstateNr].exec = NULL;
    if (ctxt->vstateNr >= 1)
	ctxt->vstate = &ctxt->vstateTab[ctxt->vstateNr - 1];
    else
	ctxt->vstate = NULL;
    return(ctxt->vstateNr);
}